

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int emit_string(nghttp2_bufs *bufs,uint8_t *str,size_t len)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *in_RDX;
  nghttp2_bufs *in_RSI;
  bool bVar3;
  int huffman;
  size_t enclen;
  size_t blocklen;
  uint8_t *bufp;
  uint8_t sb [16];
  int rv;
  uint8_t *local_50;
  uint8_t uVar4;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  puVar1 = (uint8_t *)nghttp2_hd_huff_encode_count((uint8_t *)in_RSI,(size_t)in_RDX);
  bVar3 = puVar1 < in_RDX;
  local_50 = in_RDX;
  if (bVar3) {
    local_50 = puVar1;
  }
  sVar2 = count_encoded_length((size_t)local_50,7);
  if (sVar2 < 0x11) {
    uVar4 = '\0';
    if (bVar3) {
      uVar4 = 0x80;
    }
    encode_length(&stack0xffffffffffffffc8,(size_t)local_50,7);
    local_4 = nghttp2_bufs_add((nghttp2_bufs *)
                               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (local_4 == 0) {
      if (bVar3) {
        local_4 = nghttp2_hd_huff_encode(in_RSI,in_RDX,(ulong)in_stack_ffffffffffffffd8);
      }
      else {
        if (local_50 != in_RDX) {
          __assert_fail("enclen == len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_hd.c"
                        ,0x3f3,"int emit_string(nghttp2_bufs *, const uint8_t *, size_t)");
        }
        local_4 = nghttp2_bufs_add((nghttp2_bufs *)(ulong)in_stack_ffffffffffffffd8,
                                   in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
  }
  else {
    local_4 = -0x20b;
  }
  return local_4;
}

Assistant:

static int emit_string(nghttp2_bufs *bufs, const uint8_t *str, size_t len) {
  int rv;
  uint8_t sb[16];
  uint8_t *bufp;
  size_t blocklen;
  size_t enclen;
  int huffman = 0;

  enclen = nghttp2_hd_huff_encode_count(str, len);

  if (enclen < len) {
    huffman = 1;
  } else {
    enclen = len;
  }

  blocklen = count_encoded_length(enclen, 7);

  DEBUGF("deflatehd: emit string str=%.*s, length=%zu, huffman=%d, "
         "encoded_length=%zu\n",
         (int)len, (const char *)str, len, huffman, enclen);

  if (sizeof(sb) < blocklen) {
    return NGHTTP2_ERR_HEADER_COMP;
  }

  bufp = sb;
  *bufp = huffman ? 1 << 7 : 0;
  encode_length(bufp, enclen, 7);

  rv = nghttp2_bufs_add(bufs, sb, blocklen);
  if (rv != 0) {
    return rv;
  }

  if (huffman) {
    rv = nghttp2_hd_huff_encode(bufs, str, len);
  } else {
    assert(enclen == len);
    rv = nghttp2_bufs_add(bufs, str, len);
  }

  return rv;
}